

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_compress.hpp
# Opt level: O2

bool __thiscall
duckdb::AlpRDCompressionState<float>::HasEnoughSpace(AlpRDCompressionState<float> *this)

{
  data_ptr_t pdVar1;
  
  pdVar1 = BufferHandle::Ptr(&this->handle);
  return pdVar1 + ((ulong)(this->actual_dictionary_size_bytes + 7) + this->data_bytes_used +
                   (this->state).left_bit_packed_size + (this->state).right_bit_packed_size +
                   (ulong)(this->state).exceptions_count * 4 + 9 & 0xfffffffffffffff8) <
         this->metadata_ptr + -4;
}

Assistant:

bool HasEnoughSpace() {
		//! If [start of block + used space + required space] is more than whats left (current position
		//! of metadata pointer - the size of a new metadata pointer)
		if ((handle.Ptr() + AlignValue(UsedSpace() + RequiredSpace())) >=
		    (metadata_ptr - AlpRDConstants::METADATA_POINTER_SIZE)) {
			return false;
		}
		return true;
	}